

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O0

string * __thiscall
Test::Formats::to_string_abi_cxx11_(string *__return_storage_ptr__,Formats *this,longdouble val)

{
  allocator<char> local_a9;
  char local_a8 [8];
  char buffer [128];
  longdouble val_local;
  
  stack0xffffffffffffffd8 = val;
  snprintf(local_a8,0x80,"%Lg");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_a8,&local_a9);
  std::allocator<char>::~allocator(&local_a9);
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::to_string(long double val) {
  char buffer[128];
#ifdef _MSC_VER
  sprintf_s(buffer, sizeof(buffer), "%Lg", val);
#else
  snprintf(buffer, sizeof(buffer), "%Lg", val);
#endif
  return buffer;
}